

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

void __thiscall
cfd::core::DescriptorKeyReference::DescriptorKeyReference
          (DescriptorKeyReference *this,KeyData *key,string *arg)

{
  KeyData *this_00;
  pointer pcVar1;
  pointer puVar2;
  bool bVar3;
  DescriptorKeyType DVar4;
  undefined1 local_b8 [88];
  pointer local_60;
  pointer puStack_58;
  pointer puStack_50;
  pointer local_48;
  ExtPrivkey *local_40;
  SchnorrPubkey *local_38;
  
  this->key_type_ = kDescriptorKeyPublic;
  local_38 = &this->schnorr_pubkey_;
  SchnorrPubkey::SchnorrPubkey(local_38);
  KeyData::GetPubkey(&this->pubkey_,key);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  local_40 = &this->extprivkey_;
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  this_00 = &this->key_data_;
  KeyData::KeyData(this_00,key);
  (this->argument_)._M_dataplus._M_p = (pointer)&(this->argument_).field_2;
  if (arg == (string *)0x0) {
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->argument_,"");
  }
  else {
    pcVar1 = (arg->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&this->argument_,pcVar1,pcVar1 + arg->_M_string_length);
  }
  bVar3 = KeyData::HasExtPrivkey(this_00);
  if (bVar3) {
    KeyData::GetExtPrivkey((ExtPrivkey *)local_b8,this_00);
    puVar2 = (this->extprivkey_).serialize_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->extprivkey_).serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_b8._0_8_;
    (this->extprivkey_).serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_b8._8_8_;
    (this->extprivkey_).serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._16_8_;
    local_b8._0_8_ = (pointer)0x0;
    local_b8._8_8_ = (pointer)0x0;
    local_b8._16_8_ = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
    }
    (this->extprivkey_).version_ = local_b8._24_4_;
    (this->extprivkey_).fingerprint_ = local_b8._28_4_;
    (this->extprivkey_).depth_ = local_b8[0x20];
    *(undefined3 *)&(this->extprivkey_).field_0x21 = local_b8._33_3_;
    (this->extprivkey_).child_num_ = local_b8._36_4_;
    puVar2 = (this->extprivkey_).chaincode_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->extprivkey_).chaincode_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_b8._40_8_;
    (this->extprivkey_).chaincode_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_b8._48_8_;
    (this->extprivkey_).chaincode_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._56_8_;
    local_b8._40_8_ = (pointer)0x0;
    local_b8._48_8_ = (pointer)0x0;
    local_b8._56_8_ = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
    }
    puVar2 = (this->extprivkey_).privkey_.data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->extprivkey_).privkey_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_b8._64_8_;
    *(undefined8 *)
     ((long)&(this->extprivkey_).privkey_.data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data + 8) = local_b8._72_8_;
    *(undefined8 *)
     ((long)&(this->extprivkey_).privkey_.data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data + 0x10) = local_b8._80_8_;
    local_b8._64_8_ = (pointer)0x0;
    local_b8._72_8_ = (pointer)0x0;
    local_b8._80_8_ = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
    }
    *(pointer *)&(this->extprivkey_).privkey_.is_compressed_ = local_60;
    puVar2 = (this->extprivkey_).tweak_sum_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->extprivkey_).tweak_sum_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puStack_58;
    (this->extprivkey_).tweak_sum_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_50;
    (this->extprivkey_).tweak_sum_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_48;
    puStack_58 = (pointer)0x0;
    puStack_50 = (pointer)0x0;
    local_48 = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
    }
    if (puStack_58 != (pointer)0x0) {
      operator_delete(puStack_58);
    }
    if ((pointer)local_b8._64_8_ != (pointer)0x0) {
      operator_delete((void *)local_b8._64_8_);
    }
    if ((pointer)local_b8._40_8_ != (pointer)0x0) {
      operator_delete((void *)local_b8._40_8_);
    }
    if ((pointer)local_b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_b8._0_8_);
    }
    DVar4 = kDescriptorKeyBip32Priv;
  }
  else {
    bVar3 = KeyData::HasExtPubkey(this_00);
    if (!bVar3) goto LAB_0041e874;
    KeyData::GetExtPubkey((ExtPubkey *)local_b8,this_00);
    puVar2 = (this->extpubkey_).serialize_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->extpubkey_).serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_b8._0_8_;
    (this->extpubkey_).serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_b8._8_8_;
    (this->extpubkey_).serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._16_8_;
    local_b8._0_8_ = (pointer)0x0;
    local_b8._8_8_ = (pointer)0x0;
    local_b8._16_8_ = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
    }
    (this->extpubkey_).version_ = local_b8._24_4_;
    (this->extpubkey_).fingerprint_ = local_b8._28_4_;
    (this->extpubkey_).depth_ = local_b8[0x20];
    *(undefined3 *)&(this->extpubkey_).field_0x21 = local_b8._33_3_;
    (this->extpubkey_).child_num_ = local_b8._36_4_;
    puVar2 = (this->extpubkey_).chaincode_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->extpubkey_).chaincode_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_b8._40_8_;
    (this->extpubkey_).chaincode_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_b8._48_8_;
    (this->extpubkey_).chaincode_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._56_8_;
    local_b8._40_8_ = (pointer)0x0;
    local_b8._48_8_ = (pointer)0x0;
    local_b8._56_8_ = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
    }
    puVar2 = (this->extpubkey_).pubkey_.data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->extpubkey_).pubkey_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_b8._64_8_;
    *(undefined8 *)
     ((long)&(this->extpubkey_).pubkey_.data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data + 8) = local_b8._72_8_;
    *(undefined8 *)
     ((long)&(this->extpubkey_).pubkey_.data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data + 0x10) = local_b8._80_8_;
    local_b8._64_8_ = (pointer)0x0;
    local_b8._72_8_ = (pointer)0x0;
    local_b8._80_8_ = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
    }
    puVar2 = (this->extpubkey_).tweak_sum_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->extpubkey_).tweak_sum_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = local_60;
    (this->extpubkey_).tweak_sum_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_58;
    (this->extpubkey_).tweak_sum_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puStack_50;
    local_60 = (pointer)0x0;
    puStack_58 = (pointer)0x0;
    puStack_50 = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
    }
    if (local_60 != (pointer)0x0) {
      operator_delete(local_60);
    }
    if ((pointer)local_b8._64_8_ != (pointer)0x0) {
      operator_delete((void *)local_b8._64_8_);
    }
    if ((pointer)local_b8._40_8_ != (pointer)0x0) {
      operator_delete((void *)local_b8._40_8_);
    }
    if ((pointer)local_b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_b8._0_8_);
    }
    DVar4 = kDescriptorKeyBip32;
  }
  this->key_type_ = DVar4;
LAB_0041e874:
  SchnorrPubkey::FromPubkey((SchnorrPubkey *)local_b8,&this->pubkey_,(bool *)0x0);
  puVar2 = (this->schnorr_pubkey_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->schnorr_pubkey_).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_b8._0_8_;
  (this->schnorr_pubkey_).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_b8._8_8_;
  (this->schnorr_pubkey_).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_b8._16_8_;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (pointer)0x0;
  local_b8._16_8_ = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  if ((pointer)local_b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_b8._0_8_);
  }
  return;
}

Assistant:

DescriptorKeyReference::DescriptorKeyReference(
    const KeyData& key, const std::string* arg)
    : key_type_(DescriptorKeyType::kDescriptorKeyPublic),
      pubkey_(key.GetPubkey()),
      key_data_(key),
      argument_((arg) ? *arg : "") {
  if (key_data_.HasExtPrivkey()) {
    extprivkey_ = key_data_.GetExtPrivkey();
    key_type_ = DescriptorKeyType::kDescriptorKeyBip32Priv;
  } else if (key_data_.HasExtPubkey()) {
    extpubkey_ = key_data_.GetExtPubkey();
    key_type_ = DescriptorKeyType::kDescriptorKeyBip32;
  }
  schnorr_pubkey_ = SchnorrPubkey::FromPubkey(pubkey_);
}